

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O0

void __thiscall HighsNodeQueue::unlink_suboptimal(HighsNodeQueue *this,int64_t node)

{
  char *in_RSI;
  SuboptimalNodeRbTree *in_RDI;
  SuboptimalNodeRbTree rbTree;
  HighsNodeQueue *in_stack_ffffffffffffffc8;
  CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree> local_28;
  char *local_10;
  
  local_10 = in_RSI;
  SuboptimalNodeRbTree::SuboptimalNodeRbTree(in_RDI,in_stack_ffffffffffffffc8);
  ::highs::CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree>::unlink(&local_28,local_10);
  in_RDI[5].super_CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree>.first_ =
       (LinkType *)
       ((long)in_RDI[5].super_CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree>.first_ + -1);
  return;
}

Assistant:

void HighsNodeQueue::unlink_suboptimal(int64_t node) {
  assert(node != -1);
  SuboptimalNodeRbTree rbTree(this);
  rbTree.unlink(node);
  --numSuboptimal;
}